

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
closest_gap(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
            *this,int pos)

{
  int iVar1;
  uint64_t *puVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  
  iVar1 = this->data_capacity_;
  puVar2 = this->bitmap_;
  uVar9 = iVar1 - 1;
  if ((int)uVar9 < pos) {
    pos = uVar9;
  }
  uVar11 = pos >> 6;
  uVar15 = pos & 0x3f;
  uVar8 = (ulong)(int)uVar11;
  uVar5 = puVar2[uVar8];
  if ((uVar5 == 0xffffffffffffffff) ||
     ((iVar10 = this->bitmap_size_, uVar11 == iVar10 - 1U &&
      (POPCOUNT(uVar5) == (long)(iVar1 + iVar10 * -0x40 + 0x40))))) {
    iVar10 = (int)uVar9 >> 6;
    uVar4 = iVar10 - uVar11;
    uVar9 = uVar11;
    if ((int)uVar4 < (int)uVar11) {
      uVar9 = uVar4;
    }
    if ((int)uVar9 < 1) {
      iVar17 = 1;
    }
    else {
      lVar18 = uVar8 + 2;
      iVar17 = uVar9 + 1;
      iVar12 = uVar11 * 0x40;
      lVar14 = 0;
      do {
        uVar8 = uVar8 - 1;
        uVar5 = puVar2[uVar8];
        uVar16 = puVar2[lVar18 + -1];
        iVar13 = (int)lVar14;
        if ((uVar5 != 0xffffffffffffffff) && (uVar16 != 0xffffffffffffffff)) {
          iVar10 = 0;
          for (uVar16 = ~uVar16; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            iVar10 = iVar10 + 1;
          }
          iVar6 = (~(uint)LZCOUNT(~uVar5) + iVar12) - iVar13;
          iVar7 = iVar13 + 0x40 + iVar10 + iVar12;
          iVar17 = iVar6;
          if (iVar13 + 0x40 + (iVar12 - pos) + iVar10 <
              (int)(iVar13 + 1 + pos + uVar11 * -0x40 + (uint)LZCOUNT(~uVar5))) {
            iVar17 = iVar7;
          }
          if (iVar7 < iVar1) {
            return iVar17;
          }
          return iVar6;
        }
        if (uVar5 != 0xffffffffffffffff) {
          iVar10 = ((iVar12 - (int)LZCOUNT(~uVar5)) - iVar13) + -1;
          if (uVar15 < 0x21) {
            return iVar10;
          }
          if (this->bitmap_size_ <= (int)lVar18) {
            return iVar10;
          }
          if (puVar2[lVar18] == 0xffffffffffffffff) {
            return iVar10;
          }
          iVar17 = 0;
          for (uVar8 = ~puVar2[lVar18]; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
            iVar17 = iVar17 + 1;
          }
          iVar7 = iVar12 + iVar13 + 0x80 + iVar17;
          iVar6 = iVar10;
          if ((iVar12 - pos) + iVar13 + 0x80 + iVar17 <
              (int)(iVar13 + 1 + (int)LZCOUNT(~uVar5) + pos + uVar11 * -0x40)) {
            iVar6 = iVar7;
          }
          if (iVar7 < iVar1) {
            return iVar6;
          }
          return iVar10;
        }
        if (uVar16 != 0xffffffffffffffff) {
          iVar6 = 0;
          for (uVar16 = ~uVar16; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            iVar6 = iVar6 + 1;
          }
          if (iVar13 + 0x40 + iVar12 + iVar6 < iVar1) {
            iVar1 = iVar13 + 0x40 + iVar12 + iVar6;
            if (0x1f < uVar15 || (long)uVar8 < 1) {
              return iVar1;
            }
            if (puVar2[(uVar8 & 0xffffffff) - 1] == 0xffffffffffffffff) {
              return iVar1;
            }
            iVar10 = (int)LZCOUNT(~puVar2[(uVar8 & 0xffffffff) - 1]);
            if (iVar13 + 0x40 + iVar6 + (iVar12 - pos) <
                (int)(iVar13 + 0x41 + pos + uVar11 * -0x40 + iVar10)) {
              return iVar1;
            }
            return ((iVar12 - iVar10) - iVar13) + -0x41;
          }
        }
        lVar18 = lVar18 + 1;
        lVar14 = lVar14 + 0x40;
      } while ((ulong)uVar9 << 6 != lVar14);
    }
    if ((int)uVar4 < (int)uVar11) {
      iVar12 = -1;
      if (-1 < (int)(uVar11 - iVar17)) {
        uVar15 = uVar11 * 0x40 + iVar17 * -0x40 | 0x3f;
        uVar9 = uVar11 - iVar17;
        do {
          if (puVar2[uVar9] != 0xffffffffffffffff) {
            return uVar15 - (int)LZCOUNT(~puVar2[uVar9]);
          }
          uVar15 = uVar15 - 0x40;
          bVar3 = 0 < (int)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar3);
      }
    }
    else {
      iVar17 = iVar17 + uVar11;
      iVar12 = -1;
      if (iVar17 <= iVar10) {
        lVar18 = (long)iVar17;
        iVar17 = iVar17 * -0x40;
        do {
          if (puVar2[lVar18] != 0xffffffffffffffff) {
            iVar10 = 0;
            for (uVar5 = ~puVar2[lVar18]; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000)
            {
              iVar10 = iVar10 + 1;
            }
            if (iVar1 <= iVar10 - iVar17) {
              return -1;
            }
            return iVar10 - iVar17;
          }
          lVar18 = lVar18 + 1;
          iVar17 = iVar17 + -0x40;
        } while (iVar10 + 1 != lVar18);
      }
    }
  }
  else {
    uVar16 = ~uVar5 & -1L << uVar15;
    if (uVar16 == 0) {
      iVar17 = 0x40;
      if ((int)(uVar11 + 1) < iVar10) {
        iVar10 = 0;
        for (uVar16 = ~puVar2[(int)(uVar11 + 1)]; (uVar16 & 1) == 0;
            uVar16 = uVar16 >> 1 | 0x8000000000000000) {
          iVar10 = iVar10 + 1;
        }
        iVar17 = (iVar10 - uVar15) + 0x40;
      }
    }
    else {
      iVar17 = 0;
      for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
        iVar17 = iVar17 + 1;
      }
      iVar17 = iVar17 - uVar15;
    }
    uVar5 = -1L << uVar15 | uVar5;
    if (uVar5 == 0xffffffffffffffff) {
      if ((int)uVar11 < 1) {
        iVar10 = 0x40;
      }
      else {
        iVar10 = uVar15 + 1 + (int)LZCOUNT(~puVar2[uVar8 - 1]);
      }
    }
    else {
      iVar10 = (uVar15 - 0x3f) + (int)LZCOUNT(~uVar5);
    }
    iVar12 = iVar17 + pos;
    if (iVar1 <= iVar17 + pos) {
      iVar12 = pos - iVar10;
    }
    if (iVar10 <= iVar17) {
      iVar12 = pos - iVar10;
    }
  }
  return iVar12;
}

Assistant:

int closest_gap(int pos) const {
    pos = std::min(pos, data_capacity_ - 1);
    int bitmap_pos = pos >> 6;
    int bit_pos = pos - (bitmap_pos << 6);
    if (bitmap_[bitmap_pos] == static_cast<uint64_t>(-1) ||
        (bitmap_pos == bitmap_size_ - 1 &&
         _mm_popcnt_u64(bitmap_[bitmap_pos]) ==
             data_capacity_ - ((bitmap_size_ - 1) << 6))) {
      // no gaps in this block of 64 positions, start searching in adjacent
      // blocks
      int left_bitmap_pos = 0;
      int right_bitmap_pos = ((data_capacity_ - 1) >> 6);  // inclusive
      int max_left_bitmap_offset = bitmap_pos - left_bitmap_pos;
      int max_right_bitmap_offset = right_bitmap_pos - bitmap_pos;
      int max_bidirectional_bitmap_offset =
          std::min<int>(max_left_bitmap_offset, max_right_bitmap_offset);
      int bitmap_distance = 1;
      while (bitmap_distance <= max_bidirectional_bitmap_offset) {
        uint64_t left_bitmap_data = bitmap_[bitmap_pos - bitmap_distance];
        uint64_t right_bitmap_data = bitmap_[bitmap_pos + bitmap_distance];
        if (left_bitmap_data != static_cast<uint64_t>(-1) &&
            right_bitmap_data != static_cast<uint64_t>(-1)) {
          int left_gap_pos = ((bitmap_pos - bitmap_distance + 1) << 6) -
                             static_cast<int>(_lzcnt_u64(~left_bitmap_data)) -
                             1;
          int right_gap_pos = ((bitmap_pos + bitmap_distance) << 6) +
                              static_cast<int>(_tzcnt_u64(~right_bitmap_data));
          if (pos - left_gap_pos <= right_gap_pos - pos ||
              right_gap_pos >= data_capacity_) {
            return left_gap_pos;
          } else {
            return right_gap_pos;
          }
        } else if (left_bitmap_data != static_cast<uint64_t>(-1)) {
          int left_gap_pos = ((bitmap_pos - bitmap_distance + 1) << 6) -
                             static_cast<int>(_lzcnt_u64(~left_bitmap_data)) -
                             1;
          // also need to check next block to the right
          if (bit_pos > 32 && bitmap_pos + bitmap_distance + 1 < bitmap_size_ &&
              bitmap_[bitmap_pos + bitmap_distance + 1] !=
                  static_cast<uint64_t>(-1)) {
            int right_gap_pos =
                ((bitmap_pos + bitmap_distance + 1) << 6) +
                static_cast<int>(
                    _tzcnt_u64(~bitmap_[bitmap_pos + bitmap_distance + 1]));
            if (pos - left_gap_pos <= right_gap_pos - pos ||
                right_gap_pos >= data_capacity_) {
              return left_gap_pos;
            } else {
              return right_gap_pos;
            }
          } else {
            return left_gap_pos;
          }
        } else if (right_bitmap_data != static_cast<uint64_t>(-1)) {
          int right_gap_pos = ((bitmap_pos + bitmap_distance) << 6) +
                              static_cast<int>(_tzcnt_u64(~right_bitmap_data));
          if (right_gap_pos < data_capacity_) {
            // also need to check next block to the left
            if (bit_pos < 32 && bitmap_pos - bitmap_distance > 0 &&
                bitmap_[bitmap_pos - bitmap_distance - 1] !=
                    static_cast<uint64_t>(-1)) {
              int left_gap_pos =
                  ((bitmap_pos - bitmap_distance) << 6) -
                  static_cast<int>(
                      _lzcnt_u64(~bitmap_[bitmap_pos - bitmap_distance - 1])) -
                  1;
              if (pos - left_gap_pos <= right_gap_pos - pos ||
                  right_gap_pos >= data_capacity_) {
                return left_gap_pos;
              } else {
                return right_gap_pos;
              }
            } else {
              return right_gap_pos;
            }
          }
        }
        bitmap_distance++;
      }
      if (max_left_bitmap_offset > max_right_bitmap_offset) {
        for (int i = bitmap_pos - bitmap_distance; i >= left_bitmap_pos; i--) {
          if (bitmap_[i] != static_cast<uint64_t>(-1)) {
            return ((i + 1) << 6) - static_cast<int>(_lzcnt_u64(~bitmap_[i])) -
                   1;
          }
        }
      } else {
        for (int i = bitmap_pos + bitmap_distance; i <= right_bitmap_pos; i++) {
          if (bitmap_[i] != static_cast<uint64_t>(-1)) {
            int right_gap_pos =
                (i << 6) + static_cast<int>(_tzcnt_u64(~bitmap_[i]));
            if (right_gap_pos >= data_capacity_) {
              return -1;
            } else {
              return right_gap_pos;
            }
          }
        }
      }
      return -1;
    } else {
      // search within block of 64 positions
      uint64_t bitmap_data = bitmap_[bitmap_pos];
      int closest_right_gap_distance = 64;
      int closest_left_gap_distance = 64;
      // Logically gaps to the right of pos, in the bitmap these are gaps to the
      // left of pos's bit
      // This covers the case where pos is a gap
      // For example, if pos is 3, then bitmap '10101101' -> bitmap_right_gaps
      // '01010000'
      uint64_t bitmap_right_gaps = ~(bitmap_data | ((1ULL << bit_pos) - 1));
      if (bitmap_right_gaps != 0) {
        closest_right_gap_distance =
            static_cast<int>(_tzcnt_u64(bitmap_right_gaps)) - bit_pos;
      } else if (bitmap_pos + 1 < bitmap_size_) {
        // look in the next block to the right
        closest_right_gap_distance =
            64 + static_cast<int>(_tzcnt_u64(~bitmap_[bitmap_pos + 1])) -
            bit_pos;
      }
      // Logically gaps to the left of pos, in the bitmap these are gaps to the
      // right of pos's bit
      // For example, if pos is 3, then bitmap '10101101' -> bitmap_left_gaps
      // '00000010'
      uint64_t bitmap_left_gaps = (~bitmap_data) & ((1ULL << bit_pos) - 1);
      if (bitmap_left_gaps != 0) {
        closest_left_gap_distance =
            bit_pos - (63 - static_cast<int>(_lzcnt_u64(bitmap_left_gaps)));
      } else if (bitmap_pos > 0) {
        // look in the next block to the left
        closest_left_gap_distance =
            bit_pos + static_cast<int>(_lzcnt_u64(~bitmap_[bitmap_pos - 1])) +
            1;
      }

      if (closest_right_gap_distance < closest_left_gap_distance &&
          pos + closest_right_gap_distance < data_capacity_) {
        return pos + closest_right_gap_distance;
      } else {
        return pos - closest_left_gap_distance;
      }
    }
  }